

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

uint32 * rw::ps2::instanceXYZW(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  V3d *pVVar2;
  int8 *piVar3;
  ulong uVar4;
  float32 fVar5;
  
  pVVar2 = g->morphTargets->vertices;
  piVar3 = getADCbitsForMesh(g,m);
  for (uVar4 = (ulong)idx; uVar4 < n + idx; uVar4 = uVar4 + 1) {
    uVar1 = m->indices[uVar4];
    *p = (uint32)pVVar2[uVar1].x;
    ((float32 *)p)[1] = pVVar2[uVar1].y;
    ((float32 *)p)[2] = pVVar2[uVar1].z;
    fVar5 = 0.0;
    if (piVar3 != (int8 *)0x0) {
      fVar5 = (float32)((uint)(piVar3[uVar4] != '\0') << 0xf);
    }
    ((float32 *)p)[3] = fVar5;
    p = (uint32 *)((float32 *)p + 4);
  }
  return (uint32 *)(float32 *)p;
}

Assistant:

uint32*
instanceXYZW(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->morphTargets[0].vertices;
	int8 *adcbits = getADCbitsForMesh(g, m);
	for(uint32 i = idx; i < idx+n; i++){
		j = m->indices[i];
		*p++ = d[j*3+0];
		*p++ = d[j*3+1];
		*p++ = d[j*3+2];
		*p++ = adcbits && adcbits[i] ? 0x8000 : 0;
	}
	// don't need to pad
	return p;
}